

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

string * base64::encode_abi_cxx11_(char *buffer,size_t size,alphabet alphabet)

{
  undefined4 in_ECX;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  string *in_RDI;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  alphabet in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar1;
  
  uVar1 = (uint)in_stack_ffffffffffffffe0;
  std::__cxx11::string::string((string *)in_RDI);
  required_encode_size((size_t)in_RDX.container);
  std::__cxx11::string::reserve((ulong)in_RDI);
  std::back_inserter<std::__cxx11::string>(in_stack_ffffffffffffff88);
  encode<char_const*,std::back_insert_iterator<std::__cxx11::string>>
            ((char *)CONCAT44(in_ECX,uVar1),in_stack_ffffffffffffffd8,in_RDX,
             in_stack_ffffffffffffffd4);
  return in_RDI;
}

Assistant:

static std::string encode(const char* buffer, std::size_t size, alphabet alphabet = alphabet::standard)
    {
        std::string result;

        result.reserve(required_encode_size(size) + 1);

        encode(buffer, buffer + size, std::back_inserter(result), alphabet);

        return result;
    }